

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O3

int __thiscall QPDFFormFieldObjectHelper::getQuadding(QPDFFormFieldObjectHelper *this)

{
  undefined8 this_00;
  element_type *peVar1;
  bool bVar2;
  longlong i;
  undefined1 local_58 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  element_type *peStack_20;
  
  local_48._M_pi = &local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"/Q","");
  getInheritableFieldValue((QPDFFormFieldObjectHelper *)local_58,(string *)this);
  if (local_48._M_pi != &local_38) {
    operator_delete(local_48._M_pi,(ulong)((long)(_func_int ***)local_38._vptr__Sp_counted_base + 1)
                   );
  }
  bVar2 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_58);
  if (!bVar2) {
    local_48._M_pi = &local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"/Q","");
    getFieldFromAcroForm((QPDFFormFieldObjectHelper *)&stack0xffffffffffffffd8,(string *)this);
    peVar1 = peStack_20;
    local_58._0_8_ = local_28._M_pi;
    this_00 = local_58._8_8_;
    local_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peStack_20 = (element_type *)0x0;
    local_58._8_8_ = peVar1;
    if ((element_type *)this_00 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      if (peStack_20 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_20);
      }
    }
    if (local_48._M_pi != &local_38) {
      operator_delete(local_48._M_pi,
                      (ulong)((long)(_func_int ***)local_38._vptr__Sp_counted_base + 1));
    }
  }
  bVar2 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_58);
  i = 0;
  if (bVar2) {
    i = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)local_58);
    if ((int)i != i) {
      QIntC::IntConverter<long_long,_int,_true,_true>::error(i);
    }
  }
  if ((element_type *)local_58._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  return (int)i;
}

Assistant:

int
QPDFFormFieldObjectHelper::getQuadding()
{
    QPDFObjectHandle fv = getInheritableFieldValue("/Q");
    bool looked_in_acroform = false;
    if (!fv.isInteger()) {
        fv = getFieldFromAcroForm("/Q");
        looked_in_acroform = true;
    }
    int result = 0;
    if (fv.isInteger()) {
        QTC::TC("qpdf", "QPDFFormFieldObjectHelper Q present", looked_in_acroform ? 0 : 1);
        result = QIntC::to_int(fv.getIntValue());
    }
    return result;
}